

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

SuffixHandler<double> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<double>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,StringRef name,int kind)

{
  int num_values;
  BasicMutSuffix<double> BVar1;
  Kind kind_00;
  SuffixTable local_50;
  
  kind_00 = kind & PROBLEM;
  SuffixManager::Check(kind_00);
  num_values = GetSuffixSize(this,kind_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  BVar1 = BasicSuffixSet<std::allocator<char>_>::Add<double>
                    ((this->super_SuffixManager).suffixes_ + kind_00,name,kind,num_values,&local_50)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  return (BasicMutSuffix<double>)
         (BasicMutSuffix<double>)BVar1.super_BasicSuffix<double>.super_SuffixBase.impl_;
}

Assistant:

SuffixHandler<T> AddSuffix(fmt::StringRef name, int kind) {
    auto main_kind = (suf::Kind)(kind & suf::KIND_MASK);
    return SuffixHandler<T>(
          suffixes(main_kind).template Add<T>(name, kind, GetSuffixSize(main_kind)));
  }